

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_mem.c
# Opt level: O3

int lj_opt_fwd_sbuf(jit_State *J,IRRef lim)

{
  ushort uVar1;
  IRIns *pIVar2;
  
  if (lim < J->chain[0x56]) {
    return 0;
  }
  uVar1 = J->chain[0x62];
  if (lim < uVar1) {
    pIVar2 = (J->cur).ir;
    do {
      if ((ushort)(*(short *)((long)pIVar2 + (ulong)uVar1 * 8 + 2) - 7U) < 0x17) {
        return 0;
      }
      uVar1 = *(ushort *)((long)pIVar2 + (ulong)uVar1 * 8 + 6);
    } while ((ushort)lim < uVar1);
  }
  uVar1 = J->chain[0x61];
  if (lim < uVar1) {
    pIVar2 = (J->cur).ir;
    do {
      if ((ushort)(*(short *)((long)pIVar2 + (ulong)uVar1 * 8 + 2) - 7U) < 0x17) {
        return 0;
      }
      uVar1 = *(ushort *)((long)pIVar2 + (ulong)uVar1 * 8 + 6);
    } while ((ushort)lim < uVar1);
  }
  return 1;
}

Assistant:

int LJ_FASTCALL lj_opt_fwd_sbuf(jit_State *J, IRRef lim)
{
  IRRef ref;
  if (J->chain[IR_BUFPUT] > lim)
    return 0;  /* Conflict. */
  ref = J->chain[IR_CALLS];
  while (ref > lim) {
    IRIns *ir = IR(ref);
    if (ir->op2 >= IRCALL_lj_strfmt_putint && ir->op2 < IRCALL_lj_buf_tostr)
      return 0;  /* Conflict. */
    ref = ir->prev;
  }
  ref = J->chain[IR_CALLL];
  while (ref > lim) {
    IRIns *ir = IR(ref);
    if (ir->op2 >= IRCALL_lj_strfmt_putint && ir->op2 < IRCALL_lj_buf_tostr)
      return 0;  /* Conflict. */
    ref = ir->prev;
  }
  return 1;  /* No conflict. Can safely FOLD/CSE. */
}